

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O0

void __thiscall
Eigen::TriangularView<Eigen::Matrix<double,-1,-1,0,-1,-1>const,5u>::
solveInPlace<1,Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,5u> *this,
          MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *_other)

{
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  Index IVar1;
  Index IVar2;
  Index IVar3;
  MatrixTypeNestedCleaned *lhs;
  bool bVar4;
  OtherCopy otherCopy;
  Matrix<double,__1,__1,_0,__1,__1> *other;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *_other_local;
  TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5U> *this_local;
  
  this_00 = &EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::const_cast_derived
                       ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)_other)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
  IVar1 = TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5U>::cols
                    ((TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5U> *)this);
  IVar2 = TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5U>::rows
                    ((TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5U> *)this);
  bVar4 = false;
  if (IVar1 == IVar2) {
    IVar1 = TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5U>::cols
                      ((TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5U> *)this);
    IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(this_00);
    bVar4 = IVar1 == IVar3;
  }
  if (!bVar4) {
    __assert_fail("cols() == rows() && ((Side==OnTheLeft && cols() == other.rows()) || (Side==OnTheRight && cols() == other.cols()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/SolveTriangular.h"
                  ,0xb1,
                  "void Eigen::TriangularView<const Eigen::Matrix<double, -1, -1>, 5>::solveInPlace(const MatrixBase<OtherDerived> &) const [MatrixType = const Eigen::Matrix<double, -1, -1>, Mode = 5, Side = 1, OtherDerived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  lhs = TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5U>::nestedExpression
                  ((TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5U> *)this);
  internal::
  triangular_solver_selector<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_5,_0,_-1>
  ::run(lhs,(Matrix<double,__1,__1,_0,__1,__1> *)this_00);
  return;
}

Assistant:

void TriangularView<MatrixType,Mode>::solveInPlace(const MatrixBase<OtherDerived>& _other) const
{
  OtherDerived& other = _other.const_cast_derived();
  eigen_assert( cols() == rows() && ((Side==OnTheLeft && cols() == other.rows()) || (Side==OnTheRight && cols() == other.cols())) );
  eigen_assert((!(Mode & ZeroDiag)) && bool(Mode & (Upper|Lower)));

  enum { copy = internal::traits<OtherDerived>::Flags & RowMajorBit  && OtherDerived::IsVectorAtCompileTime };
  typedef typename internal::conditional<copy,
    typename internal::plain_matrix_type_column_major<OtherDerived>::type, OtherDerived&>::type OtherCopy;
  OtherCopy otherCopy(other);

  internal::triangular_solver_selector<MatrixType, typename internal::remove_reference<OtherCopy>::type,
    Side, Mode>::run(nestedExpression(), otherCopy);

  if (copy)
    other = otherCopy;
}